

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_gal_tests.cc
# Opt level: O0

void __thiscall
lf::uscalfe::test::lf_full_bd_a_3_Test::~lf_full_bd_a_3_Test(lf_full_bd_a_3_Test *this)

{
  lf_full_bd_a_3_Test *this_local;
  
  ~lf_full_bd_a_3_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_full, bd_a_3) {
  // Four levels of refinement
  const int reflevels = REFLEV;
  std::cout << "<<<< TEST: Boundary energy test 3, f = exp(x*y) >>>>"
            << std::endl;

  std::cout << "eta = x^2+y^2 => energy = 9.58358.." << std::endl;
  // Synthetic function
  auto v = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return std::exp(x[0] * x[1]); });
  // Impedance coefficient
  auto eta = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return (x[0] * x[0] + x[1] * x[1]); });

  auto en{LinFEInterfaceEnergyTest(reflevels, v, eta)};
  EXPECT_NEAR(en.back(), 9.58358, 1.0E-3);
}